

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepthImage.cpp
# Opt level: O1

DepthImage * __thiscall DepthImage::operator+=(DepthImage *this,DepthImage *oth)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  pointer pRVar5;
  pointer pRVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar3 = (this->color).m_Size.y;
  if (0 < iVar3) {
    iVar4 = (this->color).m_Size.x;
    iVar7 = 0;
    do {
      if (0 < iVar4) {
        lVar8 = (long)iVar7;
        lVar9 = 0;
        do {
          lVar10 = (this->depth).m_Size.x * lVar8 + lVar9;
          pRVar5 = (this->depth).m_Data.
                   super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = (oth->depth).m_Size.x * lVar8 + lVar9;
          pRVar6 = (oth->depth).m_Data.
                   super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar2 = *(float *)((long)&half::_toFloat + (ulong)pRVar6[lVar11].r._h * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)pRVar5[lVar10].r._h * 4);
          if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
            (this->color).m_Data.super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
            _M_impl.super__Vector_impl_data._M_start[(this->color).m_Size.x * lVar8 + lVar9] =
                 (oth->color).m_Data.
                 super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl.
                 super__Vector_impl_data._M_start[(oth->color).m_Size.x * lVar8 + lVar9];
            pRVar5[lVar10] = pRVar6[lVar11];
          }
          lVar9 = lVar9 + 1;
        } while (iVar4 != (int)lVar9);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar3);
  }
  return this;
}

Assistant:

DepthImage &DepthImage::operator+=(const DepthImage &oth) {

    auto w = color.Width();
    auto h = color.Height();

    for (int y = 0; y < h; ++y) {
        for (int x = 0; x < w; ++x) {

            // c - color, d - depth

            // My data
            auto &c_me = color.PixelAt(x, y);
            auto &d_me = depth.PixelAt(x, y);

            // Oth data
            const auto &c_oth = oth.color.PixelAt(x, y);
            const auto &d_oth = oth.depth.PixelAt(x, y);

            // Depth test
            if (d_me.r < d_oth.r) {
                c_me = c_oth;
                d_me = d_oth;
            }
        }
    }

    return *this;
}